

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Mesh::upsample(Mesh *this)

{
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar1;
  Scene *pSVar2;
  XFormWidget *pXVar3;
  _List_node_base *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  
  plVar1 = &(this->mesh).faces;
  p_Var4 = (_List_node_base *)plVar1;
  do {
    p_Var4 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var4->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar1) {
      MeshResampler::upsample((MeshResampler *)&this->field_0x1f0,&this->mesh);
      for (p_Var4 = (this->mesh).vertices.
                    super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
          p_Var4 != (_List_node_base *)&(this->mesh).vertices; p_Var4 = p_Var4->_M_next) {
        p_Var4[4]._M_next = p_Var4[2]._M_prev;
        p_Var4[3]._M_next = p_Var4[1]._M_prev;
        p_Var4[3]._M_prev = p_Var4[2]._M_next;
      }
      pSVar2 = (this->super_SceneObject).scene;
      (pSVar2->selected).coordinates.z = 0.0;
      (pSVar2->selected).coordinates.x = 0.0;
      (pSVar2->selected).coordinates.y = 0.0;
      (pSVar2->selected).object = (SceneObject *)0x0;
      (pSVar2->selected).element = (HalfedgeElement *)0x0;
      (pSVar2->selected).axis = None;
      pSVar2 = (this->super_SceneObject).scene;
      (pSVar2->hovered).coordinates.z = 0.0;
      (pSVar2->hovered).coordinates.x = 0.0;
      (pSVar2->hovered).coordinates.y = 0.0;
      (pSVar2->hovered).object = (SceneObject *)0x0;
      (pSVar2->hovered).element = (HalfedgeElement *)0x0;
      (pSVar2->hovered).axis = None;
      pXVar3 = ((this->super_SceneObject).scene)->elementTransform;
      (pXVar3->target).coordinates.z = 0.0;
      (pXVar3->target).coordinates.x = 0.0;
      (pXVar3->target).coordinates.y = 0.0;
      (pXVar3->target).object = (SceneObject *)0x0;
      (pXVar3->target).element = (HalfedgeElement *)0x0;
      (pXVar3->target).axis = None;
      return;
    }
    lVar5 = 3;
    p_Var6 = p_Var4[0xb]._M_prev;
    do {
      p_Var6 = p_Var6[2]._M_next;
      lVar5 = lVar5 + -1;
    } while (p_Var4[0xb]._M_prev != p_Var6);
  } while (lVar5 == 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Warning: refusing to apply Loop subdivision to surface with non-triangular faces!",
             0x51);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(Try triangulating first.)",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void Mesh::upsample() {
  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if (f->degree() != 3) {
      cerr << "Warning: refusing to apply Loop subdivision to surface with "
              "non-triangular faces!"
           << endl;
      cerr << "(Try triangulating first.)" << endl;
      return;
    }
  }
  resampler.upsample(mesh);
  // Make sure the bind position is set
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->bindPosition = v->position;
  }
  scene->selected.clear();
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}